

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O0

void __thiscall
dxil_spv::Converter::add_local_root_constants
          (Converter *this,uint32_t register_space,uint32_t register_index,uint32_t num_words)

{
  pointer pIVar1;
  vector<dxil_spv::DescriptorTableEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::DescriptorTableEntry>_>
  *this_00;
  undefined1 local_48 [8];
  LocalRootSignatureEntry entry;
  uint32_t num_words_local;
  uint32_t register_index_local;
  uint32_t register_space_local;
  Converter *this_local;
  
  local_48._0_4_ = Constants;
  local_48._4_4_ = 0;
  entry.type = Constants;
  entry.field_1.constants.register_space = 0;
  this_00 = (vector<dxil_spv::DescriptorTableEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::DescriptorTableEntry>_>
             *)((long)&entry.field_1 + 4);
  entry.table_entries.
  super__Vector_base<dxil_spv::DescriptorTableEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::DescriptorTableEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = num_words;
  memset(this_00,0,0x18);
  std::
  vector<dxil_spv::DescriptorTableEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::DescriptorTableEntry>_>
  ::vector(this_00);
  local_48._0_4_ = Constants;
  entry.field_1.constants.register_space =
       entry.table_entries.
       super__Vector_base<dxil_spv::DescriptorTableEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::DescriptorTableEntry>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  local_48._4_4_ = register_space;
  entry.type = register_index;
  pIVar1 = std::
           unique_ptr<dxil_spv::Converter::Impl,_std::default_delete<dxil_spv::Converter::Impl>_>::
           operator->(&this->impl);
  std::
  vector<dxil_spv::LocalRootSignatureEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::LocalRootSignatureEntry>_>
  ::push_back(&pIVar1->local_root_signature,(value_type *)local_48);
  LocalRootSignatureEntry::~LocalRootSignatureEntry((LocalRootSignatureEntry *)local_48);
  return;
}

Assistant:

void Converter::add_local_root_constants(uint32_t register_space, uint32_t register_index, uint32_t num_words)
{
	LocalRootSignatureEntry entry = {};
	entry.type = LocalRootSignatureType::Constants;
	entry.constants.num_words = num_words;
	entry.constants.register_space = register_space;
	entry.constants.register_index = register_index;
	impl->local_root_signature.push_back(entry);
}